

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O2

int luaV_flttointeger(lua_Number n,lua_Integer *p,F2Imod mode)

{
  undefined8 uVar1;
  ulong uVar2;
  undefined1 in_register_00001208 [56];
  undefined1 auVar3 [64];
  double dVar4;
  undefined1 auVar5 [16];
  
  auVar3._8_56_ = in_register_00001208;
  auVar3._0_8_ = n;
  auVar5 = vroundsd_avx(auVar3._0_16_,auVar3._0_16_,9);
  dVar4 = auVar5._0_8_;
  if ((dVar4 != n) || (NAN(dVar4) || NAN(n))) {
    if (mode == F2Ieq) {
      return 0;
    }
    if (mode == F2Iceil) {
      auVar5._8_8_ = 0;
      auVar5._0_8_ = dVar4 + 1.0;
    }
  }
  uVar1 = vcmppd_avx512vl(ZEXT816(0xc3e0000000000000),auVar5,2);
  uVar2 = vcmppd_avx512vl(auVar5,ZEXT816(0x43e0000000000000),1);
  uVar2 = ((byte)uVar1 & 3) & uVar2;
  if ((uVar2 & 1) != 0) {
    *p = (long)auVar5._0_8_;
  }
  return (uint)uVar2 & 1;
}

Assistant:

int luaV_flttointeger (lua_Number n, lua_Integer *p, F2Imod mode) {
  lua_Number f = l_floor(n);
  if (n != f) {  /* not an integral value? */
    if (mode == F2Ieq) return 0;  /* fails if mode demands integral value */
    else if (mode == F2Iceil)  /* needs ceil? */
      f += 1;  /* convert floor to ceil (remember: n != f) */
  }
  return lua_numbertointeger(f, p);
}